

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::image::anon_unknown_2::BinaryAtomicInstanceBase::iterate
          (TestStatus *__return_storage_ptr__,BinaryAtomicInstanceBase *this)

{
  uint uVar1;
  uint depth;
  VkImage image;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer_s *pVVar2;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> data;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> data_00;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkImageSubresourceRange subresourceRange_02;
  RefData<vk::Handle<(vk::HandleType)13>_> data_01;
  RefData<vk::Handle<(vk::HandleType)14>_> data_02;
  RefData<vk::Handle<(vk::HandleType)16>_> data_03;
  RefData<vk::Handle<(vk::HandleType)18>_> data_04;
  RefData<vk::Handle<(vk::HandleType)24>_> data_05;
  RefData<vk::VkCommandBuffer_s_*> data_06;
  deUint32 dVar3;
  int iVar4;
  deUint32 dVar5;
  uint uVar6;
  VkImageViewType imageViewType;
  VkFormat format;
  deInt32 s;
  VkDevice device_00;
  DeviceInterface *vk;
  VkQueue queue_00;
  Allocator *allocator_00;
  ulong bufferSize;
  Image *pIVar7;
  VkImage *pVVar8;
  Allocation *this_00;
  uint *puVar9;
  void *data_07;
  VkDeviceSize VVar10;
  Buffer *pBVar11;
  ProgramCollection<vk::ProgramBinary> *this_01;
  ProgramBinary *binary;
  Handle<(vk::HandleType)19> *pHVar12;
  Handle<(vk::HandleType)16> *pHVar13;
  Handle<(vk::HandleType)14> *pHVar14;
  Handle<(vk::HandleType)24> *pHVar15;
  VkCommandBuffer_s **ppVVar16;
  Handle<(vk::HandleType)18> *pHVar17;
  Handle<(vk::HandleType)22> *pHVar18;
  VkBuffer *pVVar19;
  VkExtent3D VVar20;
  undefined8 in_stack_fffffffffffff5f8;
  deUint64 dVar21;
  undefined4 in_stack_fffffffffffff600;
  undefined4 uVar22;
  undefined4 in_stack_fffffffffffff604;
  undefined4 uVar23;
  bool local_702;
  allocator<char> local_701;
  string local_700;
  undefined4 local_6e0;
  allocator<char> local_6d9;
  string local_6d8;
  VkDeviceMemory local_6b8;
  Allocation *local_6b0;
  Allocation *outputBufferAllocation;
  undefined1 local_6a0 [8];
  VkBufferMemoryBarrier outputBufferPreHostReadBarrier;
  undefined1 local_648 [8];
  VkImageMemoryBarrier resultImagePostCopyBarrier;
  UVec3 local_5cc;
  VkExtent3D local_5c0;
  undefined1 local_5b0 [8];
  VkBufferImageCopy bufferImageCopyParams;
  undefined1 local_558 [8];
  VkImageMemoryBarrier resultImagePreCopyBarrier;
  undefined1 local_508 [8];
  VkBufferMemoryBarrier inputBufferPostHostWriteBarrier;
  Move<vk::VkCommandBuffer_s_*> local_4b8;
  RefData<vk::VkCommandBuffer_s_*> local_498;
  undefined1 local_478 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_438;
  undefined1 local_418 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)18>_> local_3e8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_3c8;
  undefined1 local_3a8 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::Handle<(vk::HandleType)16>_> local_380;
  RefData<vk::Handle<(vk::HandleType)16>_> local_360;
  undefined1 local_340 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  RefData<vk::Handle<(vk::HandleType)14>_> local_300;
  undefined1 local_2e0 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  VkBufferCreateInfo local_2b8;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> local_280;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *local_270;
  VkDeviceMemory local_260;
  uint local_254;
  uint local_250;
  deUint32 x;
  deUint32 y;
  deUint32 z;
  PixelBufferAccess inputPixelBuffer;
  UVec3 gridSize;
  IVec4 initialValue;
  Allocation *inputBufferAllocation;
  VkBufferCreateInfo local_1f0;
  undefined1 local_1b8 [8];
  Buffer inputBuffer;
  Move<vk::Handle<(vk::HandleType)13>_> local_160;
  RefData<vk::Handle<(vk::HandleType)13>_> local_140;
  VkAllocationCallbacks *pVStack_11c;
  VkImageSubresourceRange subresourceRange;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> local_f0;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *local_e0;
  VkExtent3D local_d0;
  image local_bc [12];
  undefined1 local_b0 [8];
  VkImageCreateInfo imageParams;
  VkDeviceSize outBuffSizeInBytes;
  VkDeviceSize imageSizeInBytes;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  DeviceInterface *deviceInterface;
  VkDevice device;
  BinaryAtomicInstanceBase *this_local;
  
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  dVar3 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator_00 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  iVar4 = tcu::getPixelSize(this->m_format);
  dVar5 = getNumPixels(this->m_imageType,&this->m_imageSize);
  bufferSize = (ulong)(iVar4 * dVar5);
  uVar6 = (*(this->super_TestInstance)._vptr_TestInstance[3])();
  imageParams._80_8_ = ZEXT48(uVar6);
  local_b0._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  local_702 = true;
  if (this->m_imageType != IMAGE_TYPE_CUBE) {
    local_702 = this->m_imageType == IMAGE_TYPE_CUBE_ARRAY;
  }
  imageParams.pNext._0_4_ = (uint)local_702 << 4;
  imageParams.pNext._4_4_ = mapImageType(this->m_imageType);
  imageParams.flags = ::vk::mapTextureFormat(&this->m_format);
  getLayerSize(local_bc,this->m_imageType,&this->m_imageSize);
  VVar20 = ::vk::makeExtent3D((UVec3 *)local_bc);
  local_d0.depth = VVar20.depth;
  imageParams.extent.width = local_d0.depth;
  local_d0._0_8_ = VVar20._0_8_;
  imageParams.imageType = local_d0.width;
  imageParams.format = local_d0.height;
  imageParams.extent.height = 1;
  local_d0 = VVar20;
  imageParams.extent.depth = getNumLayers(this->m_imageType,&this->m_imageSize);
  imageParams.mipLevels = 1;
  imageParams.arrayLayers = 0;
  imageParams.samples = VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0;
  imageParams.queueFamilyIndexCount = 0;
  imageParams._68_4_ = 0;
  imageParams.pQueueFamilyIndices._0_4_ = 0;
  pIVar7 = (Image *)operator_new(0x30);
  image::Image::Image(pIVar7,vk,device_00,allocator_00,(VkImageCreateInfo *)local_b0,
                      ::vk::MemoryRequirement::Any);
  de::DefaultDeleter<vkt::image::Image>::DefaultDeleter
            ((DefaultDeleter<vkt::image::Image> *)((long)&subresourceRange.baseArrayLayer + 3));
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::MovePtr();
  local_e0 = de::details::MovePtr::operator_cast_to_PtrData(&local_f0,(MovePtr *)pIVar7);
  data._8_4_ = in_stack_fffffffffffff600;
  data.ptr = (Image *)in_stack_fffffffffffff5f8;
  data._12_4_ = in_stack_fffffffffffff604;
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::operator=
            (&this->m_resultImage,data);
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::~MovePtr
            ((MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)&local_f0);
  dVar5 = getNumLayers(this->m_imageType,&this->m_imageSize);
  ::vk::makeImageSubresourceRange((VkImageSubresourceRange *)&pVStack_11c,1,0,1,0,dVar5);
  pIVar7 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
           operator->(&(this->m_resultImage).
                       super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>);
  pVVar8 = image::Image::get(pIVar7);
  image.m_internal = pVVar8->m_internal;
  imageViewType = mapImageViewType(this->m_imageType);
  format = ::vk::mapTextureFormat(&this->m_format);
  inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       pVStack_11c;
  subresourceRange_00.levelCount = subresourceRange.aspectMask;
  subresourceRange_00._0_8_ = pVStack_11c;
  subresourceRange_00.baseArrayLayer = subresourceRange.baseMipLevel;
  subresourceRange_00.layerCount = subresourceRange.levelCount;
  makeImageView(&local_160,vk,device_00,image,imageViewType,format,subresourceRange_00);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_140,(Move *)&local_160);
  uVar22 = SUB84(local_140.deleter.m_deviceIface,0);
  uVar23 = (undefined4)((ulong)local_140.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_deviceIface._0_4_ = uVar22;
  data_01.object.m_internal = local_140.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = uVar23;
  data_01.deleter.m_device._0_4_ = (int)local_140.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_140.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_140.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_140.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=
            (&this->m_resultImageView,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_160);
  makeBufferCreateInfo(&local_1f0,bufferSize,1);
  image::Buffer::Buffer
            ((Buffer *)local_1b8,vk,device_00,allocator_00,&local_1f0,
             ::vk::MemoryRequirement::HostVisible);
  this_00 = image::Buffer::getAllocation((Buffer *)local_1b8);
  s = getOperationInitialValue(this->m_operation);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(gridSize.m_data + 1),s);
  getShaderGridSize((image *)((long)&inputPixelBuffer.super_ConstPixelBufferAccess.m_data + 4),
                    this->m_imageType,&this->m_imageSize);
  puVar9 = tcu::Vector<unsigned_int,_3>::x
                     ((Vector<unsigned_int,_3> *)
                      ((long)&inputPixelBuffer.super_ConstPixelBufferAccess.m_data + 4));
  uVar6 = *puVar9;
  puVar9 = tcu::Vector<unsigned_int,_3>::y
                     ((Vector<unsigned_int,_3> *)
                      ((long)&inputPixelBuffer.super_ConstPixelBufferAccess.m_data + 4));
  uVar1 = *puVar9;
  puVar9 = tcu::Vector<unsigned_int,_3>::z
                     ((Vector<unsigned_int,_3> *)
                      ((long)&inputPixelBuffer.super_ConstPixelBufferAccess.m_data + 4));
  depth = *puVar9;
  data_07 = ::vk::Allocation::getHostPtr(this_00);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&y,&this->m_format,uVar6,uVar1,depth,data_07);
  x = 0;
  dVar21 = local_140.object.m_internal;
  while( true ) {
    dVar5 = x;
    puVar9 = tcu::Vector<unsigned_int,_3>::z
                       ((Vector<unsigned_int,_3> *)
                        ((long)&inputPixelBuffer.super_ConstPixelBufferAccess.m_data + 4));
    if (*puVar9 <= dVar5) break;
    local_250 = 0;
    while( true ) {
      uVar6 = local_250;
      puVar9 = tcu::Vector<unsigned_int,_3>::y
                         ((Vector<unsigned_int,_3> *)
                          ((long)&inputPixelBuffer.super_ConstPixelBufferAccess.m_data + 4));
      if (*puVar9 <= uVar6) break;
      local_254 = 0;
      while( true ) {
        uVar6 = local_254;
        puVar9 = tcu::Vector<unsigned_int,_3>::x
                           ((Vector<unsigned_int,_3> *)
                            ((long)&inputPixelBuffer.super_ConstPixelBufferAccess.m_data + 4));
        if (*puVar9 <= uVar6) break;
        tcu::PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)&y,(IVec4 *)(gridSize.m_data + 1),local_254,local_250,x);
        local_254 = local_254 + 1;
      }
      local_250 = local_250 + 1;
    }
    x = x + 1;
  }
  local_260 = ::vk::Allocation::getMemory(this_00);
  VVar10 = ::vk::Allocation::getOffset(this_00);
  ::vk::flushMappedMemoryRange(vk,device_00,local_260,VVar10,bufferSize);
  pBVar11 = (Buffer *)operator_new(0x30);
  makeBufferCreateInfo(&local_2b8,imageParams._80_8_,2);
  shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator._4_4_ =
       ::vk::MemoryRequirement::HostVisible.m_flags;
  image::Buffer::Buffer
            (pBVar11,vk,device_00,allocator_00,&local_2b8,::vk::MemoryRequirement::HostVisible);
  de::DefaultDeleter<vkt::image::Buffer>::DefaultDeleter
            ((DefaultDeleter<vkt::image::Buffer> *)
             ((long)&shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 3));
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::MovePtr
            ((MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)&local_280);
  local_270 = de::details::MovePtr::operator_cast_to_PtrData(&local_280,(MovePtr *)pBVar11);
  data_00._8_4_ = uVar22;
  data_00.ptr = (Buffer *)dVar21;
  data_00._12_4_ = uVar23;
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::operator=
            (&this->m_outputBuffer,data_00);
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::~MovePtr
            ((MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)&local_280);
  (*(this->super_TestInstance)._vptr_TestInstance[4])();
  (*(this->super_TestInstance)._vptr_TestInstance[5])();
  this_01 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_01,&this->m_name);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)
             &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
              m_allocator,vk,device_00,binary,0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_300,
             (Move *)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                      m_allocator);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_300.deleter.m_deviceIface;
  data_02.object.m_internal = local_300.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_300.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_300.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_300.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_300.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_300.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_2e0,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)14>_> *)
             &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
              m_allocator);
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>
                      );
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar12->m_internal;
  makePipelineLayout(&local_380,vk,device_00,
                     (VkDescriptorSetLayout)
                     pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_360,(Move *)&local_380);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_360.deleter.m_deviceIface;
  data_03.object.m_internal = local_360.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_360.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_360.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_360.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_360.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_360.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_340,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_380);
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_340);
  pipelineLayout_00.m_internal = pHVar13->m_internal;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_2e0);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar14->m_internal;
  makeComputePipeline(&local_3e8,vk,device_00,pipelineLayout_00,
                      (VkShaderModule)
                      cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                      m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3c8,(Move *)&local_3e8);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_3c8.deleter.m_deviceIface;
  data_04.object.m_internal = local_3c8.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3c8.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_3c8.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_3c8.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_3c8.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_3c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_3a8,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_3e8);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk,device_00,2,
             dVar3,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_438,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_438.deleter.m_deviceIface;
  data_05.object.m_internal = local_438.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_438.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_438.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_438.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_438.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_438.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_418,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_418);
  ::vk::allocateCommandBuffer
            (&local_4b8,vk,device_00,(VkCommandPool)pHVar15->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_498,(Move *)&local_4b8);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_498.deleter.m_deviceIface;
  data_06.object = local_498.object;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_498.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device._0_4_ = (int)local_498.deleter.m_device;
  data_06.deleter.m_device._4_4_ = (int)((ulong)local_498.deleter.m_device >> 0x20);
  data_06.deleter.m_pool.m_internal._0_4_ = (int)local_498.deleter.m_pool.m_internal;
  data_06.deleter.m_pool.m_internal._4_4_ = (int)(local_498.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_478,data_06);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_4b8);
  ppVVar16 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_478);
  beginCommandBuffer(vk,*ppVVar16);
  ppVVar16 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_478);
  pVVar2 = *ppVVar16;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_3a8);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,pVVar2,1,pHVar17->m_internal);
  ppVVar16 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_478);
  pVVar2 = *ppVVar16;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_340);
  inputBufferPostHostWriteBarrier.size = pHVar13->m_internal;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                      (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,pVVar2,1,inputBufferPostHostWriteBarrier.size,0,1,pHVar18,0,0);
  pVVar19 = image::Buffer::operator*((Buffer *)local_1b8);
  resultImagePreCopyBarrier._64_8_ = pVVar19->m_internal;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_508,0x4000,0x800,
             (VkBuffer)resultImagePreCopyBarrier._64_8_,0,bufferSize);
  pIVar7 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
           operator->(&(this->m_resultImage).
                       super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>);
  pVVar8 = image::Image::get(pIVar7);
  bufferImageCopyParams.imageExtent._4_8_ = pVStack_11c;
  subresourceRange_01.levelCount = subresourceRange.aspectMask;
  subresourceRange_01._0_8_ = pVStack_11c;
  subresourceRange_01.baseArrayLayer = subresourceRange.baseMipLevel;
  subresourceRange_01.layerCount = subresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_558,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,(VkImage)pVVar8->m_internal,subresourceRange_01);
  ppVVar16 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_478);
  dVar5 = 0;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,*ppVVar16,1,0x1000,0,0,0,1,(int)local_508,1,local_558);
  getLayerSize((image *)&local_5cc,this->m_imageType,&this->m_imageSize);
  local_5c0 = ::vk::makeExtent3D(&local_5cc);
  dVar3 = getNumLayers(this->m_imageType,&this->m_imageSize);
  VVar20.height = 0;
  VVar20.width = local_5c0.depth;
  VVar20.depth = dVar3;
  makeBufferImageCopy((VkBufferImageCopy *)local_5b0,(image *)local_5c0._0_8_,VVar20,dVar5);
  ppVVar16 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_478);
  pVVar2 = *ppVVar16;
  pVVar19 = image::Buffer::operator*((Buffer *)local_1b8);
  dVar21 = pVVar19->m_internal;
  pIVar7 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
           operator->(&(this->m_resultImage).
                       super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>);
  pVVar8 = image::Image::get(pIVar7);
  resultImagePostCopyBarrier._64_8_ = pVVar8->m_internal;
  (*vk->_vptr_DeviceInterface[0x62])
            (vk,pVVar2,dVar21,resultImagePostCopyBarrier._64_8_,7,1,local_5b0);
  pIVar7 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
           operator->(&(this->m_resultImage).
                       super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>);
  pVVar8 = image::Image::get(pIVar7);
  outputBufferPreHostReadBarrier.size = (VkDeviceSize)pVStack_11c;
  subresourceRange_02.levelCount = subresourceRange.aspectMask;
  subresourceRange_02._0_8_ = pVStack_11c;
  subresourceRange_02.baseArrayLayer = subresourceRange.baseMipLevel;
  subresourceRange_02.layerCount = subresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_648,0x1000,0x20,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_GENERAL,(VkImage)pVVar8->m_internal,subresourceRange_02);
  ppVVar16 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_478);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,*ppVVar16,0x1000,0x800,0,0,0,0,0,1,local_648);
  ppVVar16 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_478);
  (*(this->super_TestInstance)._vptr_TestInstance[6])(this,*ppVVar16);
  ppVVar16 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_478);
  pVVar2 = *ppVVar16;
  puVar9 = tcu::Vector<unsigned_int,_3>::x
                     ((Vector<unsigned_int,_3> *)
                      ((long)&inputPixelBuffer.super_ConstPixelBufferAccess.m_data + 4));
  uVar6 = *puVar9;
  puVar9 = tcu::Vector<unsigned_int,_3>::y
                     ((Vector<unsigned_int,_3> *)
                      ((long)&inputPixelBuffer.super_ConstPixelBufferAccess.m_data + 4));
  uVar1 = *puVar9;
  puVar9 = tcu::Vector<unsigned_int,_3>::z
                     ((Vector<unsigned_int,_3> *)
                      ((long)&inputPixelBuffer.super_ConstPixelBufferAccess.m_data + 4));
  (*vk->_vptr_DeviceInterface[0x5d])(vk,pVVar2,(ulong)(uVar6 * 5),(ulong)uVar1,(ulong)*puVar9);
  ppVVar16 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_478);
  (*(this->super_TestInstance)._vptr_TestInstance[7])(this,*ppVVar16);
  pBVar11 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
            operator->(&(this->m_outputBuffer).
                        super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                      );
  pVVar19 = image::Buffer::get(pBVar11);
  outputBufferAllocation = (Allocation *)pVVar19->m_internal;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_6a0,0x1000,0x2000,(VkBuffer)outputBufferAllocation,0,
             imageParams._80_8_);
  ppVVar16 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_478);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,*ppVVar16,0x1000,0x4000,0,0,0,1,(int)local_6a0,0,0);
  ppVVar16 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_478);
  endCommandBuffer(vk,*ppVVar16);
  ppVVar16 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_478);
  submitCommandsAndWait(vk,device_00,queue_00,*ppVVar16);
  pBVar11 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
            operator->(&(this->m_outputBuffer).
                        super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                      );
  local_6b0 = image::Buffer::getAllocation(pBVar11);
  local_6b8 = ::vk::Allocation::getMemory(local_6b0);
  VVar10 = ::vk::Allocation::getOffset(local_6b0);
  ::vk::invalidateMappedMemoryRange(vk,device_00,local_6b8,VVar10,imageParams._80_8_);
  uVar6 = (*(this->super_TestInstance)._vptr_TestInstance[8])(this,local_6b0);
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_700,"Comparison failed",&local_701);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_700);
    std::__cxx11::string::~string((string *)&local_700);
    std::allocator<char>::~allocator(&local_701);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d8,"Comparison succeeded",&local_6d9);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_6d8);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::allocator<char>::~allocator(&local_6d9);
  }
  local_6e0 = 1;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_478);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_418);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_3a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_340);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_2e0);
  image::Buffer::~Buffer((Buffer *)local_1b8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	BinaryAtomicInstanceBase::iterate (void)
{
	const VkDevice			device				= m_context.getDevice();
	const DeviceInterface&	deviceInterface		= m_context.getDeviceInterface();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();
	const VkDeviceSize		imageSizeInBytes	= tcu::getPixelSize(m_format) * getNumPixels(m_imageType, m_imageSize);
	const VkDeviceSize		outBuffSizeInBytes	= getOutputBufferSize();

	const VkImageCreateInfo imageParams	=
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,					// VkStructureType			sType;
		DE_NULL,												// const void*				pNext;
		(m_imageType == IMAGE_TYPE_CUBE ||
		 m_imageType == IMAGE_TYPE_CUBE_ARRAY ?
		 (VkImageCreateFlags)VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT :
		 (VkImageCreateFlags)0u),								// VkImageCreateFlags		flags;
		mapImageType(m_imageType),								// VkImageType				imageType;
		mapTextureFormat(m_format),								// VkFormat					format;
		makeExtent3D(getLayerSize(m_imageType, m_imageSize)),	// VkExtent3D				extent;
		1u,														// deUint32					mipLevels;
		getNumLayers(m_imageType, m_imageSize),					// deUint32					arrayLayers;
		VK_SAMPLE_COUNT_1_BIT,									// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,								// VkImageTiling			tiling;
		VK_IMAGE_USAGE_STORAGE_BIT |
		VK_IMAGE_USAGE_TRANSFER_SRC_BIT |
		VK_IMAGE_USAGE_TRANSFER_DST_BIT,						// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,								// VkSharingMode			sharingMode;
		0u,														// deUint32					queueFamilyIndexCount;
		DE_NULL,												// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,								// VkImageLayout			initialLayout;
	};

	//Create the image that is going to store results of atomic operations
	m_resultImage = de::MovePtr<Image>(new Image(deviceInterface, device, allocator, imageParams, MemoryRequirement::Any));

	const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, getNumLayers(m_imageType, m_imageSize));

	m_resultImageView = makeImageView(deviceInterface, device, m_resultImage->get(), mapImageViewType(m_imageType), mapTextureFormat(m_format), subresourceRange);

	//Prepare the buffer with the initial data for the image
	const Buffer inputBuffer(deviceInterface, device, allocator, makeBufferCreateInfo(imageSizeInBytes, VK_BUFFER_USAGE_TRANSFER_SRC_BIT), MemoryRequirement::HostVisible);

	Allocation& inputBufferAllocation = inputBuffer.getAllocation();

	//Prepare the initial data for the image
	const tcu::IVec4 initialValue(getOperationInitialValue(m_operation));

	tcu::UVec3 gridSize = getShaderGridSize(m_imageType, m_imageSize);
	tcu::PixelBufferAccess inputPixelBuffer(m_format, gridSize.x(), gridSize.y(), gridSize.z(), inputBufferAllocation.getHostPtr());

	for (deUint32 z = 0; z < gridSize.z(); z++)
	for (deUint32 y = 0; y < gridSize.y(); y++)
	for (deUint32 x = 0; x < gridSize.x(); x++)
	{
		inputPixelBuffer.setPixel(initialValue, x, y, z);
	}

	flushMappedMemoryRange(deviceInterface, device, inputBufferAllocation.getMemory(), inputBufferAllocation.getOffset(), imageSizeInBytes);

	// Create a buffer to store shader output copied from result image
	m_outputBuffer = de::MovePtr<Buffer>(new Buffer(deviceInterface, device, allocator, makeBufferCreateInfo(outBuffSizeInBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible));

	prepareResources();

	prepareDescriptors();

	// Create pipeline
	const Unique<VkShaderModule>	shaderModule(createShaderModule(deviceInterface, device, m_context.getBinaryCollection().get(m_name), 0));
	const Unique<VkPipelineLayout>	pipelineLayout(makePipelineLayout(deviceInterface, device, *m_descriptorSetLayout));
	const Unique<VkPipeline>		pipeline(makeComputePipeline(deviceInterface, device, *pipelineLayout, *shaderModule));

	// Create command buffer
	const Unique<VkCommandPool>		cmdPool(createCommandPool(deviceInterface, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer(allocateCommandBuffer(deviceInterface, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	beginCommandBuffer(deviceInterface, *cmdBuffer);

	deviceInterface.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	deviceInterface.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &m_descriptorSet.get(), 0u, DE_NULL);

	const VkBufferMemoryBarrier inputBufferPostHostWriteBarrier	=
		makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT,
								VK_ACCESS_TRANSFER_READ_BIT,
								*inputBuffer,
								0ull,
								imageSizeInBytes);

	const VkImageMemoryBarrier	resultImagePreCopyBarrier =
		makeImageMemoryBarrier(	0u,
								VK_ACCESS_TRANSFER_WRITE_BIT,
								VK_IMAGE_LAYOUT_UNDEFINED,
								VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
								m_resultImage->get(),
								subresourceRange);

	deviceInterface.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, DE_FALSE, 0u, DE_NULL, 1u, &inputBufferPostHostWriteBarrier, 1u, &resultImagePreCopyBarrier);

	const VkBufferImageCopy		bufferImageCopyParams = makeBufferImageCopy(makeExtent3D(getLayerSize(m_imageType, m_imageSize)), getNumLayers(m_imageType, m_imageSize));

	deviceInterface.cmdCopyBufferToImage(*cmdBuffer, *inputBuffer, m_resultImage->get(), VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1u, &bufferImageCopyParams);

	const VkImageMemoryBarrier	resultImagePostCopyBarrier	=
		makeImageMemoryBarrier(	VK_ACCESS_TRANSFER_WRITE_BIT,
								VK_ACCESS_SHADER_READ_BIT,
								VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
								VK_IMAGE_LAYOUT_GENERAL,
								m_resultImage->get(),
								subresourceRange);

	deviceInterface.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, DE_FALSE, 0u, DE_NULL, 0u, DE_NULL, 1u, &resultImagePostCopyBarrier);

	commandsBeforeCompute(*cmdBuffer);

	deviceInterface.cmdDispatch(*cmdBuffer, NUM_INVOCATIONS_PER_PIXEL*gridSize.x(), gridSize.y(), gridSize.z());

	commandsAfterCompute(*cmdBuffer);

	const VkBufferMemoryBarrier	outputBufferPreHostReadBarrier
		= makeBufferMemoryBarrier(	VK_ACCESS_TRANSFER_WRITE_BIT,
									VK_ACCESS_HOST_READ_BIT,
									m_outputBuffer->get(),
									0ull,
									outBuffSizeInBytes);

	deviceInterface.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, DE_FALSE, 0u, DE_NULL, 1u, &outputBufferPreHostReadBarrier, 0u, DE_NULL);

	endCommandBuffer(deviceInterface, *cmdBuffer);

	submitCommandsAndWait(deviceInterface, device, queue, *cmdBuffer);

	Allocation& outputBufferAllocation = m_outputBuffer->getAllocation();

	invalidateMappedMemoryRange(deviceInterface, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), outBuffSizeInBytes);

	if (verifyResult(outputBufferAllocation))
		return tcu::TestStatus::pass("Comparison succeeded");
	else
		return tcu::TestStatus::fail("Comparison failed");
}